

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::AbstractDOMParser::endAttList(AbstractDOMParser *this,DTDElementDecl *elemDecl)

{
  XMLCh XVar1;
  XMLCh XVar2;
  DOMDocumentImpl *pDVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  XMLSize_t XVar8;
  undefined4 extraout_var;
  XMLCh *pXVar9;
  long *plVar10;
  long lVar11;
  long *plVar12;
  ulong uVar13;
  XMLBuffer *pXVar14;
  undefined4 extraout_var_01;
  XMLCh *pXVar15;
  undefined8 uVar16;
  long *plVar17;
  XMLCh *pXVar18;
  undefined4 extraout_var_03;
  long *plVar19;
  undefined4 extraout_var_04;
  long *plVar20;
  ulong uVar21;
  ulong uVar22;
  XMLCh *pXVar23;
  XMLBufBid bbQName;
  XMLCh temp [1000];
  XMLCh local_808 [1004];
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  bVar4 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if (bVar4) {
    pXVar14 = this->fInternalSubset;
    XVar8 = pXVar14->fIndex;
    if (XVar8 == pXVar14->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar14,1);
      XVar8 = pXVar14->fIndex;
    }
    pXVar14->fIndex = XVar8 + 1;
    pXVar14->fBuffer[XVar8] = L'>';
  }
  iVar5 = (*(elemDecl->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[7])(elemDecl);
  if ((char)iVar5 != '\0') {
    iVar5 = (*(elemDecl->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[5])(elemDecl)
    ;
    plVar20 = (long *)CONCAT44(extraout_var,iVar5);
    pDVar3 = this->fDocument;
    pXVar9 = QName::getRawName((elemDecl->super_XMLElementDecl).fElementName);
    iVar5 = (*(pDVar3->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x38])(pDVar3,pXVar9);
    plVar10 = (long *)CONCAT44(extraout_var_00,iVar5);
    bVar4 = this->fScanner->fDoNamespaces;
    lVar11 = (**(code **)(*plVar20 + 0x50))(plVar20);
    if (lVar11 != 0) {
      uVar22 = 0;
LAB_002d7b3e:
      plVar12 = (long *)(**(code **)(*plVar20 + 0x58))(plVar20,uVar22);
      if (plVar12[4] != 0) {
        if (bVar4 != false) {
          pXVar9 = (XMLCh *)(**(code **)(*plVar12 + 0x28))(plVar12);
          uVar21 = 0;
          uVar13 = 0xffffffff;
          iVar5 = 0;
          do {
            if (pXVar9[uVar21] == L':') {
              iVar5 = iVar5 + 1;
              uVar13 = uVar21 & 0xffffffff;
            }
            else if (pXVar9[uVar21] == L'\0') goto code_r0x002d7b90;
            uVar21 = uVar21 + 1;
          } while( true );
        }
        pDVar3 = this->fDocument;
        uVar16 = (**(code **)(*plVar12 + 0x28))(plVar12);
        iVar5 = (*(pDVar3->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x32])(pDVar3,uVar16);
        plVar17 = (long *)CONCAT44(extraout_var_02,iVar5);
        plVar19 = (long *)(**(code **)(*plVar10 + 0x168))(plVar10,plVar17);
        if (plVar19 != (long *)0x0) {
          (**(code **)(*plVar19 + 0x138))(plVar19);
        }
        goto LAB_002d7dba;
      }
      goto LAB_002d7dd8;
    }
LAB_002d7ded:
    iVar5 = (*(this->fDocumentType->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0x38])();
    plVar20 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar5) + 0x10))
                                ((long *)CONCAT44(extraout_var_04,iVar5),plVar10);
    if (plVar20 != (long *)0x0) {
      (**(code **)(*plVar20 + 0x138))(plVar20);
    }
  }
  return;
code_r0x002d7b90:
  uVar6 = (uint)uVar13;
  uVar7 = 0xffffffff;
  if (((uVar6 != 0 && (int)uVar21 != 0) && (iVar5 < 2 && (int)uVar21 - 1U != uVar6)) &&
     (uVar7 = uVar6, uVar6 == 0xffffffff)) {
    uVar7 = 0;
  }
  pXVar14 = XMLBufferMgr::bidOnBuffer(&this->fBufMgr);
  if ((int)uVar7 < 1) {
    if (pXVar9 != L"xmlns") {
      pXVar18 = L"xmlns";
      if (pXVar9 != (XMLCh *)0x0) {
        pXVar18 = L"xmlns";
        pXVar23 = pXVar9;
        do {
          XVar1 = *pXVar23;
          if (XVar1 == L'\0') goto LAB_002d7d51;
          pXVar23 = pXVar23 + 1;
          XVar2 = *pXVar18;
          pXVar18 = pXVar18 + 1;
        } while (XVar1 == XVar2);
        goto LAB_002d7d66;
      }
LAB_002d7d51:
      if (*pXVar18 != L'\0') goto LAB_002d7d66;
    }
    XMLBuffer::append(pXVar14,L"http://www.w3.org/2000/xmlns/");
    goto LAB_002d7d66;
  }
  pXVar18 = local_808;
  if (999 < uVar7) {
    iVar5 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                      (this->fMemoryManager,(ulong)(uVar7 * 2 + 2));
    pXVar18 = (XMLCh *)CONCAT44(extraout_var_01,iVar5);
  }
  XMLString::subString(pXVar18,pXVar9,0,(ulong)uVar7,this->fMemoryManager);
  pXVar23 = L"http://www.w3.org/2000/xmlns/";
  if (pXVar18 != L"xmlns") {
    pXVar15 = L"xmlns";
    if (pXVar18 == (XMLCh *)0x0) {
LAB_002d7d0f:
      pXVar23 = L"http://www.w3.org/2000/xmlns/";
      if (*pXVar15 == L'\0') goto LAB_002d7d23;
    }
    else {
      pXVar15 = L"xmlns";
      pXVar23 = pXVar18;
      do {
        XVar1 = *pXVar23;
        if (XVar1 == L'\0') goto LAB_002d7d0f;
        pXVar23 = pXVar23 + 1;
        XVar2 = *pXVar15;
        pXVar15 = pXVar15 + 1;
      } while (XVar1 == XVar2);
    }
    pXVar23 = L"http://www.w3.org/XML/1998/namespace";
  }
LAB_002d7d23:
  XMLBuffer::append(pXVar14,pXVar23);
  if (999 < uVar7) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,pXVar18);
  }
LAB_002d7d66:
  pDVar3 = this->fDocument;
  pXVar18 = pXVar14->fBuffer;
  pXVar18[pXVar14->fIndex] = L'\0';
  iVar5 = (*(pDVar3->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x53])(pDVar3,pXVar18,pXVar9);
  plVar17 = (long *)CONCAT44(extraout_var_03,iVar5);
  plVar19 = (long *)(**(code **)(*plVar10 + 0x1a0))(plVar10,plVar17);
  if (plVar19 != (long *)0x0) {
    (**(code **)(*plVar19 + 0x138))(plVar19);
  }
  XMLBufferMgr::releaseBuffer(&this->fBufMgr,pXVar14);
LAB_002d7dba:
  (**(code **)(*plVar17 + 0x1c0))(plVar17,plVar12[4]);
  (**(code **)(*plVar17 + 0x198))(plVar17,0);
LAB_002d7dd8:
  uVar22 = uVar22 + 1;
  uVar13 = (**(code **)(*plVar20 + 0x50))(plVar20);
  if (uVar13 <= uVar22) goto LAB_002d7ded;
  goto LAB_002d7b3e;
}

Assistant:

void AbstractDOMParser::endAttList
(
    const   DTDElementDecl& elemDecl
)
{
    if (fDocumentType->isIntSubsetReading())
    {
        //print the closing angle
        fInternalSubset.append(chCloseAngle);
    }

	// this section sets up default attributes.
	// default attribute nodes are stored in a NamedNodeMap DocumentTypeImpl::elements
	// default attribute data attached to the document is used to conform to the
	// DOM spec regarding creating element nodes & removing attributes with default values
	// see DocumentTypeImpl
	if (elemDecl.hasAttDefs())
	{
        XMLAttDefList* defAttrs = &elemDecl.getAttDefList();
        XMLAttDef* attr = 0;

        DOMAttrImpl * insertAttr = 0;
        DOMElement     *elem  = fDocument->createElement(elemDecl.getFullName());
        DOMElementImpl *elemImpl = (DOMElementImpl *) elem;
        bool doNamespaces = fScanner->getDoNamespaces();

        for(XMLSize_t i=0; i<defAttrs->getAttDefCount(); i++)
        {
            attr = &defAttrs->getAttDef(i);
            if (attr->getValue() != 0)
            {
                if (doNamespaces)
                {
                    // DOM Level 2 wants all namespace declaration attributes
                    // to be bound to "http://www.w3.org/2000/xmlns/"
                    // So as long as the XML parser doesn't do it, it needs to
                    // done here.
                    const XMLCh* qualifiedName = attr->getFullName();
                    int index = DOMDocumentImpl::indexofQualifiedName(qualifiedName);

                    XMLBufBid bbQName(&fBufMgr);
                    XMLBuffer& buf = bbQName.getBuffer();
                    static const XMLCh XMLNS[] = {
                        chLatin_x, chLatin_m, chLatin_l, chLatin_n, chLatin_s, chNull};

                    if (index > 0) {
                        // there is prefix
                        // map to XML URI for all cases except when prefix == "xmlns"
                        XMLCh* prefix;
                        XMLCh temp[1000];

                        if (index > 999)
                            prefix = (XMLCh*) fMemoryManager->allocate
                            (
                                (index + 1) * sizeof(XMLCh)
                            );//new XMLCh[index+1];
                        else
                            prefix = temp;

                        XMLString::subString(prefix ,qualifiedName, 0, index, fMemoryManager);

                        if (XMLString::equals(prefix,XMLNS))
                            buf.append(XMLUni::fgXMLNSURIName);
                        else
                            buf.append(XMLUni::fgXMLURIName);

                        if (index > 999)
                            fMemoryManager->deallocate(prefix);//delete [] prefix;
                    }
                    else {
                        //   No prefix
                        if (XMLString::equals(qualifiedName,XMLNS))
                            buf.append(XMLUni::fgXMLNSURIName);
                    }

                    insertAttr = (DOMAttrImpl *) fDocument->createAttributeNS(
                       buf.getRawBuffer(),     // NameSpaceURI
                       qualifiedName);   // qualified name

                    DOMNode* remAttr = elemImpl->setAttributeNodeNS(insertAttr);
                    if (remAttr)
                        remAttr->release();
                }
                else
                {
                    // Namespaces is turned off...
                    insertAttr = (DOMAttrImpl *) fDocument->createAttribute(attr->getFullName());
                    DOMNode* remAttr = elemImpl->setAttributeNode(insertAttr);
                    if (remAttr)
                        remAttr->release();
                }

                insertAttr->setValueFast(attr->getValue());
                insertAttr->setSpecified(false);
            }
        }
        DOMNode* rem = fDocumentType->getElements()->setNamedItem(elemImpl);
        if (rem)
            rem->release();
    }
}